

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O1

void write_binary<cellb>(ofstream *f,field3d<cellb> *data,
                        _func_double_field3d<cellb>_ptr_int_int_int *get,int n0,int n,int ny,int nz)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  double dVar7;
  int k;
  
  iVar2 = (n - n0) * (nz + ny);
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar6 = (long)iVar2 * 8;
  }
  pvVar3 = operator_new__(uVar6);
  if (n0 < n) {
    pvVar5 = (void *)((long)pvVar3 + (long)ny * 8);
    lVar1 = (long)(nz + ny) * 8;
    pvVar4 = pvVar3;
    do {
      if (0 < ny) {
        uVar6 = 0;
        do {
          dVar7 = (*get)(data,n0,(int)uVar6,nz / 2);
          *(double *)((long)pvVar4 + uVar6 * 8) = dVar7;
          uVar6 = uVar6 + 1;
        } while ((uint)ny != uVar6);
      }
      if (0 < nz) {
        uVar6 = 0;
        do {
          dVar7 = (*get)(data,n0,ny / 2,(int)uVar6);
          *(double *)((long)pvVar5 + uVar6 * 8) = dVar7;
          uVar6 = uVar6 + 1;
        } while ((uint)nz != uVar6);
      }
      n0 = n0 + 1;
      pvVar4 = (void *)((long)pvVar4 + lVar1);
      pvVar5 = (void *)((long)pvVar5 + lVar1);
    } while (n0 != n);
  }
  std::ostream::write((char *)f,(long)pvVar3);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void write_binary(ofstream* f, field3d<T> & data, double get(field3d<T>&,
            int, int, int), int n0, int n, int ny, int nz) {
    double* a = new double[(n - n0) * (ny + nz)]; /* for values in xy and xz
                                                     planes */
    for (int i = n0; i < n; ++i) {
        int k = nz / 2;
        for (int j = 0; j < ny; ++j)
            a[(i - n0) * (ny + nz) + j] = get(data, i, j, k);
        int j = ny / 2;
        for (int k = 0; k < nz; ++k)
            a[(i - n0) * (ny + nz) + ny + k] = get(data, i, j, k);
    }
    f->write(reinterpret_cast<char*>(a), sizeof(double) * (n - n0) * (ny +
                nz));
    delete[] a;
}